

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_chunk_append(uchar **out,size_t *outsize,uchar *chunk)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  uchar *puVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  lVar3 = 4;
  do {
    bVar5 = (chunk[lVar3] & 0xdf) + 0xa5;
    if (bVar5 < 0xe6) break;
    bVar8 = lVar3 != 7;
    lVar3 = lVar3 + 1;
  } while (bVar8);
  uVar2 = 0x79;
  if ((0xe5 < bVar5) && (uVar2 = 0x7a, (chunk[6] & 0x20) == 0)) {
    uVar2 = *(uint *)chunk;
    uVar7 = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)
            + 0xc;
    uVar1 = *outsize;
    uVar2 = 0x4d;
    if (!CARRY8(uVar7,uVar1)) {
      puVar4 = (uchar *)realloc(*out,uVar7 + uVar1);
      if (puVar4 == (uchar *)0x0) {
        uVar2 = 0x53;
      }
      else {
        *out = puVar4;
        *outsize = uVar7 + uVar1;
        uVar2 = 0;
        uVar6 = 0;
        do {
          puVar4[uVar6 + uVar1] = chunk[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar7 != (uVar6 & 0xffffffff));
      }
    }
  }
  return uVar2;
}

Assistant:

unsigned lodepng_chunk_append(unsigned char** out, size_t* outsize, const unsigned char* chunk) {
  unsigned i;
  size_t total_chunk_length, new_length;
  unsigned char *chunk_start, *new_buffer;

  if(!lodepng_chunk_type_name_valid(chunk)) {
    return 121; /* invalid chunk type name */
  }
  if(lodepng_chunk_reserved(chunk)) {
    return 122; /* invalid third lowercase character */
  }

  if(lodepng_addofl(lodepng_chunk_length(chunk), 12, &total_chunk_length)) return 77;
  if(lodepng_addofl(*outsize, total_chunk_length, &new_length)) return 77;

  new_buffer = (unsigned char*)lodepng_realloc(*out, new_length);
  if(!new_buffer) return 83; /*alloc fail*/
  (*out) = new_buffer;
  (*outsize) = new_length;
  chunk_start = &(*out)[new_length - total_chunk_length];

  for(i = 0; i != total_chunk_length; ++i) chunk_start[i] = chunk[i];

  return 0;
}